

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_fill_rect_multi_color
               (nk_draw_list *list,nk_rect rect,nk_color left,nk_color top,nk_color right,
               nk_color bottom)

{
  nk_draw_index nVar1;
  void *pvVar2;
  nk_draw_index *pnVar3;
  nk_vec2 nVar4;
  nk_draw_index index;
  nk_draw_index *idx;
  nk_colorf col_bottom;
  nk_colorf col_right;
  nk_colorf col_top;
  nk_colorf col_left;
  void *vtx;
  nk_draw_list *list_local;
  nk_color bottom_local;
  nk_color right_local;
  nk_color top_local;
  nk_color left_local;
  nk_rect rect_local;
  
  nk_color_fv(&col_top.b,left);
  nk_color_fv(&col_bottom.b,right);
  nk_color_fv(&col_right.b,top);
  nk_color_fv((float *)&idx,bottom);
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x2788,
                  "void nk_draw_list_fill_rect_multi_color(struct nk_draw_list *, struct nk_rect, struct nk_color, struct nk_color, struct nk_color, struct nk_color)"
                 );
  }
  if (list != (nk_draw_list *)0x0) {
    nk_draw_list_push_image(list,(list->config).null.texture);
    nVar1 = (nk_draw_index)list->vertex_count;
    pvVar2 = nk_draw_list_alloc_vertices(list,4);
    pnVar3 = nk_draw_list_alloc_elements(list,6);
    if ((pvVar2 != (void *)0x0) && (pnVar3 != (nk_draw_index *)0x0)) {
      *pnVar3 = nVar1;
      pnVar3[1] = nVar1 + 1;
      pnVar3[2] = nVar1 + 2;
      pnVar3[3] = nVar1;
      pnVar3[4] = nVar1 + 2;
      pnVar3[5] = nVar1 + 3;
      top_local = (nk_color)rect.x;
      left_local = (nk_color)rect.y;
      nVar4 = nk_vec2((float)top_local,(float)left_local);
      pvVar2 = nk_draw_vertex(pvVar2,&list->config,nVar4,(list->config).null.uv,
                              stack0xffffffffffffffb8);
      rect_local.x = rect.w;
      nVar4 = nk_vec2((float)top_local + rect_local.x,(float)left_local);
      pvVar2 = nk_draw_vertex(pvVar2,&list->config,nVar4,(list->config).null.uv,
                              stack0xffffffffffffffa8);
      rect_local.y = rect.h;
      nVar4 = nk_vec2((float)top_local + rect_local.x,(float)left_local + rect_local.y);
      pvVar2 = nk_draw_vertex(pvVar2,&list->config,nVar4,(list->config).null.uv,
                              stack0xffffffffffffff98);
      nVar4 = nk_vec2((float)top_local,(float)left_local + rect_local.y);
      nk_draw_vertex(pvVar2,&list->config,nVar4,(list->config).null.uv,_idx);
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_rect_multi_color(struct nk_draw_list *list, struct nk_rect rect,
    struct nk_color left, struct nk_color top, struct nk_color right,
    struct nk_color bottom)
{
    void *vtx;
    struct nk_colorf col_left, col_top;
    struct nk_colorf col_right, col_bottom;
    nk_draw_index *idx;
    nk_draw_index index;

    nk_color_fv(&col_left.r, left);
    nk_color_fv(&col_right.r, right);
    nk_color_fv(&col_top.r, top);
    nk_color_fv(&col_bottom.r, bottom);

    NK_ASSERT(list);
    if (!list) return;

    nk_draw_list_push_image(list, list->config.null.texture);
    index = (nk_draw_index)list->vertex_count;
    vtx = nk_draw_list_alloc_vertices(list, 4);
    idx = nk_draw_list_alloc_elements(list, 6);
    if (!vtx || !idx) return;

    idx[0] = (nk_draw_index)(index+0); idx[1] = (nk_draw_index)(index+1);
    idx[2] = (nk_draw_index)(index+2); idx[3] = (nk_draw_index)(index+0);
    idx[4] = (nk_draw_index)(index+2); idx[5] = (nk_draw_index)(index+3);

    vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x, rect.y), list->config.null.uv, col_left);
    vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x + rect.w, rect.y), list->config.null.uv, col_top);
    vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x + rect.w, rect.y + rect.h), list->config.null.uv, col_right);
    vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(rect.x, rect.y + rect.h), list->config.null.uv, col_bottom);
}